

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::bitTransferSigned(deInt32 *a,deInt32 *b)

{
  bool bVar1;
  deInt32 *b_local;
  deInt32 *a_local;
  
  *b = *b >> 1;
  *b = *a & 0x80U | *b;
  *a = *a >> 1;
  *a = *a & 0x3f;
  bVar1 = isBitSet(*a,5);
  if (bVar1) {
    *a = *a + -0x40;
  }
  return;
}

Assistant:

inline void bitTransferSigned (deInt32& a, deInt32& b)
{
	b >>= 1;
	b |= a & 0x80;
	a >>= 1;
	a &= 0x3f;
	if (isBitSet(a, 5))
		a -= 0x40;
}